

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin_kernel.cxx
# Opt level: O3

void ExchCXX::detail::host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinLYP>
               (double scal_fact,int N,const_host_buffer_type rho,const_host_buffer_type sigma,
               host_buffer_type eps,host_buffer_type vrho,host_buffer_type vsigma)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double vsbb;
  double vsab;
  double vsaa;
  double vrb;
  double vra;
  double e;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  const_host_buffer_type local_68;
  const_host_buffer_type local_60;
  double local_58;
  double dStack_50;
  double local_48;
  
  if (0 < N) {
    lVar4 = 2;
    lVar5 = 0;
    dVar7 = scal_fact;
    dVar8 = scal_fact;
    local_68 = sigma;
    local_60 = rho;
    local_58 = scal_fact;
    dStack_50 = scal_fact;
    local_48 = scal_fact;
    do {
      dVar9 = *(double *)((long)rho + lVar5 * 2);
      dVar10 = *(double *)((long)rho + lVar5 * 2 + 8);
      local_70 = 0.0;
      local_78 = 0.0;
      local_80 = 0.0;
      local_88 = 0.0;
      local_90 = 0.0;
      local_98 = 0.0;
      if (dVar9 + dVar10 <= 1e-32) {
        local_78 = 0.0;
        local_80 = 0.0;
        local_98 = 0.0;
        local_70 = 0.0;
        local_88 = 0.0;
        local_90 = 0.0;
      }
      else {
        dVar7 = 1e-32;
        if (1e-32 <= dVar9) {
          dVar7 = dVar9;
        }
        dVar8 = 1e-32;
        if (1e-32 <= dVar10) {
          dVar8 = dVar10;
        }
        dVar9 = 4.64158883361283e-86;
        if (4.64158883361283e-86 <= sigma[lVar4 + -2]) {
          dVar9 = sigma[lVar4 + -2];
        }
        dVar10 = 4.64158883361283e-86;
        if (4.64158883361283e-86 <= sigma[lVar4]) {
          dVar10 = sigma[lVar4];
        }
        dVar11 = (dVar9 + dVar10) * 0.5;
        uVar6 = -(ulong)(-dVar11 <= sigma[lVar4 + -1]);
        dVar3 = (double)(uVar6 & (ulong)sigma[lVar4 + -1] | ~uVar6 & (ulong)-dVar11);
        uVar6 = -(ulong)(dVar3 <= dVar11);
        kernel_traits<ExchCXX::BuiltinLYP>::eval_exc_vxc_polar_impl
                  (dVar7,dVar8,dVar9,(double)(~uVar6 & (ulong)dVar11 | uVar6 & (ulong)dVar3),dVar10,
                   &local_70,&local_78,&local_80,&local_88,&local_90,&local_98);
        sigma = local_68;
        rho = local_60;
        scal_fact = local_48;
        dVar7 = local_58;
        dVar8 = dStack_50;
      }
      *(double *)((long)eps + lVar5) = local_70 * scal_fact + *(double *)((long)eps + lVar5);
      pdVar1 = (double *)((long)vrho + lVar5 * 2);
      dVar9 = pdVar1[1];
      pdVar2 = (double *)((long)vrho + lVar5 * 2);
      *pdVar2 = local_78 * dVar7 + *pdVar1;
      pdVar2[1] = local_80 * dVar8 + dVar9;
      dVar9 = (vsigma + lVar4 + -2)[1];
      vsigma[lVar4 + -2] = local_88 * dVar7 + vsigma[lVar4 + -2];
      (vsigma + lVar4 + -2)[1] = local_90 * dVar8 + dVar9;
      vsigma[lVar4] = local_98 * scal_fact + vsigma[lVar4];
      lVar4 = lVar4 + 3;
      lVar5 = lVar5 + 8;
    } while ((ulong)(uint)N << 3 != lVar5);
  }
  return;
}

Assistant:

GGA_EXC_VXC_INC_GENERATOR( host_eval_exc_vxc_inc_helper_polar ) {

  using traits = kernel_traits<KernelType>;
  
  for( int32_t i = 0; i < N; ++i ) {

    auto* rho_i    = rho   + 2*i;
    auto* sigma_i  = sigma + 3*i;
    auto* vrho_i   = vrho   + 2*i;
    auto* vsigma_i = vsigma + 3*i;

    double e, vra, vrb, vsaa,vsab,vsbb;
    traits::eval_exc_vxc_polar( rho_i[0], rho_i[1], sigma_i[0], 
      sigma_i[1], sigma_i[2], e, vra, vrb, vsaa, vsab, vsbb );

    eps[i]      += scal_fact * e;
    vrho_i[0]   += scal_fact * vra;
    vrho_i[1]   += scal_fact * vrb;
    vsigma_i[0] += scal_fact * vsaa;
    vsigma_i[1] += scal_fact * vsab;
    vsigma_i[2] += scal_fact * vsbb;

  }

}